

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fm_ns_local_search.h
# Opt level: O1

void __thiscall
fm_ns_local_search::move_node
          (fm_ns_local_search *this,AdjList *G,NodeID *node,PartitionID *to_block,
          PartitionID *other_block,vector<int,_std::allocator<int>_> *block_weights,
          vector<bool,_std::allocator<bool>_> *moved_out_of_S,
          vector<maxNodeHeap,_std::allocator<maxNodeHeap>_> *queues,
          vector<change_set,_std::allocator<change_set>_> *rollback_info,PartialBoundary *separator)

{
  pointer *ppcVar1;
  ulong *puVar2;
  uint uVar3;
  iterator iVar4;
  pointer piVar5;
  iterator iVar6;
  pointer pvVar7;
  int *piVar8;
  int *piVar9;
  pointer pmVar10;
  change_set cVar11;
  change_set cVar12;
  iterator iVar13;
  int iVar14;
  mapped_type *pmVar15;
  int *piVar16;
  ulong uVar17;
  ulong uVar18;
  int *piVar19;
  uint uVar20;
  uint *puVar21;
  uint *puVar22;
  vector<int,_std::allocator<int>_> to_be_added;
  change_set cur_move_1;
  change_set cur_move;
  int local_b0;
  int local_ac;
  uint *local_a8;
  iterator iStack_a0;
  int *local_98;
  AdjList *local_90;
  uint *local_88;
  iterator iStack_80;
  int *local_78;
  change_set local_68;
  change_set local_60;
  vector<int,_std::allocator<int>_> *local_58;
  int *local_50;
  int *local_48;
  ulong local_40;
  PartialBoundary *local_38;
  
  local_60.node = *node;
  local_60.block =
       (this->partition_index->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
       super__Vector_impl_data._M_start[local_60.node];
  iVar4._M_current =
       (rollback_info->super__Vector_base<change_set,_std::allocator<change_set>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  local_90 = G;
  local_58 = block_weights;
  if (iVar4._M_current ==
      (rollback_info->super__Vector_base<change_set,_std::allocator<change_set>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<change_set,std::allocator<change_set>>::_M_realloc_insert<change_set_const&>
              ((vector<change_set,std::allocator<change_set>> *)rollback_info,iVar4,&local_60);
  }
  else {
    cVar12.block = local_60.block;
    cVar12.node = local_60.node;
    *iVar4._M_current = cVar12;
    ppcVar1 = &(rollback_info->super__Vector_base<change_set,_std::allocator<change_set>_>)._M_impl.
               super__Vector_impl_data._M_finish;
    *ppcVar1 = *ppcVar1 + 1;
  }
  local_88 = (uint *)CONCAT44(local_88._4_4_,*node);
  local_38 = separator + 8;
  std::
  _Hashtable<const_int,_std::pair<const_int,_is_boundary>,_std::allocator<std::pair<const_int,_is_boundary>_>,_std::__detail::_Select1st,_compare_nodes_contains,_hash_boundary_nodes,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::_M_erase();
  (this->partition_index->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_start[*node] = *to_block;
  piVar5 = (local_58->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
           ._M_start;
  piVar16 = piVar5 + *to_block;
  *piVar16 = *piVar16 + 1;
  piVar16 = piVar5 + 2;
  *piVar16 = *piVar16 + -1;
  iVar14 = *node;
  uVar17 = (ulong)iVar14;
  uVar18 = uVar17 + 0x3f;
  if (-1 < (long)uVar17) {
    uVar18 = uVar17;
  }
  puVar2 = (moved_out_of_S->super__Bvector_base<std::allocator<bool>_>)._M_impl.
           super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p +
           ((long)uVar18 >> 6) +
           (ulong)((uVar17 & 0x800000000000003f) < 0x8000000000000001) + 0xffffffffffffffff;
  *puVar2 = *puVar2 | 1L << ((byte)iVar14 & 0x3f);
  iVar6._M_current =
       (this->moved_nodes).super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar6._M_current ==
      (this->moved_nodes).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
              ((vector<int,std::allocator<int>> *)&this->moved_nodes,iVar6,node);
  }
  else {
    *iVar6._M_current = iVar14;
    (this->moved_nodes).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar6._M_current + 1;
  }
  local_88 = (uint *)0x0;
  iStack_80._M_current = (int *)0x0;
  local_78 = (int *)0x0;
  local_98 = (int *)0x0;
  local_a8 = (uint *)0x0;
  iStack_a0._M_current = (int *)0x0;
  pvVar7 = (local_90->
           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  piVar16 = pvVar7[*node].super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start;
  piVar8 = pvVar7[*node].super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  puVar21 = local_88;
  iVar6._M_current = iStack_80._M_current;
  if (piVar16 != piVar8) {
    local_40 = 0x800000000000003f;
    local_50 = node;
    local_48 = other_block;
    do {
      local_b0 = *piVar16;
      if ((this->x->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
          _M_start[local_b0] < 0) {
        piVar5 = (this->partition_index->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        if (piVar5[*node] == *other_block) {
          local_68.block =
               (this->partition_index->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start[local_b0];
          iVar4._M_current =
               (rollback_info->super__Vector_base<change_set,_std::allocator<change_set>_>)._M_impl.
               super__Vector_impl_data._M_finish;
          local_68.node = local_b0;
          if (iVar4._M_current ==
              (rollback_info->super__Vector_base<change_set,_std::allocator<change_set>_>)._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<change_set,std::allocator<change_set>>::_M_realloc_insert<change_set_const&>
                      ((vector<change_set,std::allocator<change_set>> *)rollback_info,iVar4,
                       &local_68);
          }
          else {
            cVar11.block = local_68.block;
            cVar11.node = local_b0;
            *iVar4._M_current = cVar11;
            ppcVar1 = &(rollback_info->super__Vector_base<change_set,_std::allocator<change_set>_>).
                       _M_impl.super__Vector_impl_data._M_finish;
            *ppcVar1 = *ppcVar1 + 1;
          }
          (this->partition_index->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
          super__Vector_impl_data._M_start[local_b0] = 2;
          local_ac = local_b0;
          pmVar15 = std::__detail::
                    _Map_base<const_int,_std::pair<const_int,_is_boundary>,_std::allocator<std::pair<const_int,_is_boundary>_>,_std::__detail::_Select1st,_compare_nodes_contains,_hash_boundary_nodes,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                    ::operator[]((_Map_base<const_int,_std::pair<const_int,_is_boundary>,_std::allocator<std::pair<const_int,_is_boundary>_>,_std::__detail::_Select1st,_compare_nodes_contains,_hash_boundary_nodes,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                  *)local_38,&local_ac);
          pmVar15->contains = true;
          piVar5 = (local_58->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          piVar19 = piVar5 + *other_block;
          *piVar19 = *piVar19 + -1;
          piVar19 = piVar5 + 2;
          *piVar19 = *piVar19 + 1;
          uVar17 = (ulong)local_b0;
          uVar18 = uVar17 + 0x3f;
          if (-1 < (long)uVar17) {
            uVar18 = uVar17;
          }
          if (((moved_out_of_S->super__Bvector_base<std::allocator<bool>_>)._M_impl.
               super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
               [((long)uVar18 >> 6) +
                (ulong)((uVar17 & local_40) < 0x8000000000000001) + 0xffffffffffffffff] >>
               (uVar17 & 0x3f) & 1) == 0) {
            if (iStack_80._M_current == local_78) {
              std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                        ((vector<int,std::allocator<int>> *)&local_88,iStack_80,&local_b0);
            }
            else {
              *iStack_80._M_current = local_b0;
              iStack_80._M_current = iStack_80._M_current + 1;
            }
          }
          pvVar7 = (local_90->
                   super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          piVar9 = pvVar7[local_b0].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish;
          for (piVar19 = pvVar7[local_b0].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start; other_block = local_48, node = local_50,
              piVar19 != piVar9; piVar19 = piVar19 + 1) {
            local_ac = *piVar19;
            if (((this->x->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_start[local_ac] < 0) &&
               (iVar14 = (*(((queues->super__Vector_base<maxNodeHeap,_std::allocator<maxNodeHeap>_>)
                             ._M_impl.super__Vector_impl_data._M_start)->
                           super_priority_queue_interface)._vptr_priority_queue_interface[0xd])(),
               (char)iVar14 != '\0')) {
              if (iStack_a0._M_current == local_98) {
                std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                          ((vector<int,std::allocator<int>> *)&local_a8,iStack_a0,&local_ac);
              }
              else {
                *iStack_a0._M_current = local_ac;
                iStack_a0._M_current = iStack_a0._M_current + 1;
              }
            }
          }
        }
        else if (piVar5[local_b0] == 2) {
          if (iStack_a0._M_current == local_98) {
            std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                      ((vector<int,std::allocator<int>> *)&local_a8,iStack_a0,&local_b0);
          }
          else {
            *iStack_a0._M_current = local_b0;
            iStack_a0._M_current = iStack_a0._M_current + 1;
          }
        }
      }
      piVar16 = piVar16 + 1;
      puVar21 = local_88;
      iVar6._M_current = iStack_80._M_current;
    } while (piVar16 != piVar8);
  }
  for (; iVar13._M_current = iStack_a0._M_current, puVar22 = local_a8,
      puVar21 != (uint *)iVar6._M_current; puVar21 = puVar21 + 1) {
    uVar3 = *puVar21;
    pvVar7 = (local_90->
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    piVar16 = pvVar7[(int)uVar3].super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
    piVar8 = pvVar7[(int)uVar3].super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (piVar16 == piVar8) {
      uVar18 = 1;
      uVar20 = 1;
    }
    else {
      uVar18 = 1;
      uVar20 = 1;
      do {
        if ((this->x->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
            ._M_start[*piVar16] < 0) {
          iVar14 = (this->partition_index->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_start[*piVar16];
          if (iVar14 == 1) {
            uVar18 = (ulong)((int)uVar18 - 1);
          }
          else if (iVar14 == 0) {
            uVar20 = uVar20 - 1;
          }
        }
        piVar16 = piVar16 + 1;
      } while (piVar16 != piVar8);
    }
    pmVar10 = (queues->super__Vector_base<maxNodeHeap,_std::allocator<maxNodeHeap>_>)._M_impl.
              super__Vector_impl_data._M_start;
    (*(pmVar10->super_priority_queue_interface)._vptr_priority_queue_interface[4])
              (pmVar10,(ulong)uVar3,uVar18);
    pmVar10 = (queues->super__Vector_base<maxNodeHeap,_std::allocator<maxNodeHeap>_>)._M_impl.
              super__Vector_impl_data._M_start;
    (*pmVar10[1].super_priority_queue_interface._vptr_priority_queue_interface[4])
              (pmVar10 + 1,(ulong)uVar3,(ulong)uVar20);
  }
  for (; puVar22 != (uint *)iVar13._M_current; puVar22 = puVar22 + 1) {
    uVar3 = *puVar22;
    pvVar7 = (local_90->
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    piVar16 = pvVar7[(int)uVar3].super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
    piVar8 = pvVar7[(int)uVar3].super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (piVar16 == piVar8) {
      uVar18 = 1;
      uVar20 = 1;
    }
    else {
      uVar18 = 1;
      uVar20 = 1;
      do {
        if ((this->x->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
            ._M_start[*piVar16] < 0) {
          iVar14 = (this->partition_index->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_start[*piVar16];
          if (iVar14 == 1) {
            uVar18 = (ulong)((int)uVar18 - 1);
          }
          else if (iVar14 == 0) {
            uVar20 = uVar20 - 1;
          }
        }
        piVar16 = piVar16 + 1;
      } while (piVar16 != piVar8);
    }
    pmVar10 = (queues->super__Vector_base<maxNodeHeap,_std::allocator<maxNodeHeap>_>)._M_impl.
              super__Vector_impl_data._M_start;
    (*(pmVar10->super_priority_queue_interface)._vptr_priority_queue_interface[10])
              (pmVar10,(ulong)uVar3,uVar18);
    pmVar10 = (queues->super__Vector_base<maxNodeHeap,_std::allocator<maxNodeHeap>_>)._M_impl.
              super__Vector_impl_data._M_start;
    (*pmVar10[1].super_priority_queue_interface._vptr_priority_queue_interface[10])
              (pmVar10 + 1,(ulong)uVar3,(ulong)uVar20);
  }
  if (local_a8 != (uint *)0x0) {
    operator_delete(local_a8,(long)local_98 - (long)local_a8);
  }
  if (local_88 != (uint *)0x0) {
    operator_delete(local_88,(long)local_78 - (long)local_88);
  }
  return;
}

Assistant:

inline
void fm_ns_local_search::move_node( AdjList & G, NodeID & node, PartitionID & to_block, PartitionID & other_block, 
                                    std::vector< NodeWeight > & block_weights,
                                    std::vector< bool > & moved_out_of_S, 
                                    std::vector< maxNodeHeap > & queues,
                                    std::vector< change_set > & rollback_info,
                                    PartialBoundary & separator) {

        change_set cur_move;
        cur_move.node = node;
        cur_move.block = partition_index[node];
        rollback_info.push_back(cur_move);
        separator.deleteNode(node);

        partition_index[node] = to_block;
        block_weights[to_block] += 1;
        block_weights[2] -= 1;
        moved_out_of_S[node] = true;
        moved_nodes.push_back(node);

        std::vector<NodeID> to_be_added;
        std::vector<NodeID> to_be_updated; // replace by hashmap?
        Gain gain_achieved = 1;

        for (int neighbor : G[node]) 
        {
                if (x[neighbor] < 0) {
                        if(partition_index[node] == other_block) {
                                change_set cur_move;
                                cur_move.node = neighbor;
                                cur_move.block = partition_index[neighbor];
                                rollback_info.push_back(cur_move);

                                partition_index[neighbor] = 2;
                                separator.insert(neighbor);

                                block_weights[other_block] -= 1;
                                block_weights[2]           += 1;
                                gain_achieved              -= 1;

                                if(!moved_out_of_S[neighbor]) {
                                        to_be_added.push_back(neighbor);
                                }

                                for (int v : G[neighbor]) {
                                        if(x[v] < 0) {
                                                if(queues[0].contains(v)) {
                                                        to_be_updated.push_back(v);
                                                }   
                                        }
                                }

                        } else if(partition_index[neighbor] == 2) {
                                to_be_updated.push_back(neighbor);
                        }
                }
        }        

        Gain toLHS = 0;
        Gain toRHS = 0;

        for(NodeID node : to_be_added) {
                compute_gain( G, node, toLHS, toRHS);
                queues[0].insert(node, toLHS);
                queues[1].insert(node, toRHS);
        }

        for(NodeID node : to_be_updated) {
                compute_gain( G, node, toLHS, toRHS);
                queues[0].changeKey(node, toLHS);
                queues[1].changeKey(node, toRHS);
        }
}